

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<DomProperty_*>::growAppend
          (QCommonArrayOps<DomProperty_*> *this,DomProperty **b,DomProperty **e)

{
  long n;
  DomProperty **ppDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<DomProperty_*> local_48;
  DomProperty **local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 3;
    local_48.d = (Data *)0x0;
    local_48.ptr = (DomProperty **)0x0;
    local_48.size = 0;
    ppDVar1 = (this->super_Type).super_QArrayDataPointer<DomProperty_*>.ptr;
    if ((b < ppDVar1) ||
       (ppDVar1 + (this->super_Type).super_QArrayDataPointer<DomProperty_*>.size <= b)) {
      QArrayDataPointer<DomProperty_*>::detachAndGrow
                ((QArrayDataPointer<DomProperty_*> *)this,GrowsAtEnd,n,(DomProperty ***)0x0,
                 (QArrayDataPointer<DomProperty_*> *)0x0);
      ppDVar1 = b;
    }
    else {
      QArrayDataPointer<DomProperty_*>::detachAndGrow
                ((QArrayDataPointer<DomProperty_*> *)this,GrowsAtEnd,n,&local_28,&local_48);
      ppDVar1 = local_28;
    }
    QPodArrayOps<DomProperty_*>::copyAppend
              (&this->super_Type,ppDVar1,(DomProperty **)(((long)e - (long)b) + (long)ppDVar1));
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }